

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

string * vkt::shaderexecutor::(anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_(void)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream local_188 [8];
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n{\n");
  poVar1 = std::operator<<(poVar1,
                           "\tgl_Position = vec4(gl_VertexIndex/2, gl_VertexIndex%2, 0.0, 1.0);\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string generateVertexShaderForTess (void)
{
	std::ostringstream	src;
	src <<  "#version 310 es\n"
		<< "void main (void)\n{\n"
		<< "	gl_Position = vec4(gl_VertexIndex/2, gl_VertexIndex%2, 0.0, 1.0);\n"
		<< "}\n";

	return src.str();
}